

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O2

void * chck_pool_add(chck_pool *pool,void *data,size_t *out_index)

{
  undefined8 in_RAX;
  void *pvVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  undefined8 uStack_38;
  
  if (pool != (chck_pool *)0x0) {
    sVar3 = (pool->removed).count;
    uStack_38 = in_RAX;
    if (sVar3 == 0) {
      sVar4 = (pool->items).count;
    }
    else {
      sVar3 = sVar3 - 1;
      sVar4 = *(size_t *)((pool->removed).buffer + sVar3 * (pool->removed).member);
      pool_buffer_remove_move(&pool->removed,sVar3);
    }
    uStack_38 = CONCAT17(1,(undefined7)uStack_38);
    pvVar2 = (void *)0x0;
    pvVar1 = pool_buffer_add(&pool->map,(void *)((long)&uStack_38 + 7),(pool->map).member * sVar4,
                             (size_t *)0x0);
    if (pvVar1 != (void *)0x0) {
      pvVar2 = pool_buffer_add(&pool->items,data,(pool->items).member * sVar4,out_index);
      if (pvVar2 == (void *)0x0) {
        pool_buffer_remove(&pool->map,sVar4 * (pool->map).member,(_func_size_t_varargs *)pool,
                           out_index);
        pvVar2 = (void *)0x0;
      }
    }
    return pvVar2;
  }
  __assert_fail("pool",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c",
                0x173,"void *chck_pool_add(struct chck_pool *, const void *, size_t *)");
}

Assistant:

void*
chck_pool_add(struct chck_pool *pool, const void *data, size_t *out_index)
{
   assert(pool);
   const size_t slot = pool_get_free_slot(pool);

   if (!pool_buffer_add(&pool->map, (bool[]){true}, slot * pool->map.member, NULL))
      return NULL;

   void *p;
   if (!(p = pool_buffer_add(&pool->items, data, slot * pool->items.member, out_index))) {
      pool_buffer_remove(&pool->map, slot * pool->map.member, pool_get_used, pool);
      return NULL;
   }

   return p;
}